

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVRFile.cpp
# Opt level: O1

void __thiscall BVRFile::BVRFile(BVRFile *this,vector<char,_std::allocator<char>_> *buf)

{
  pointer *ppBVar1;
  pointer *ppBVar2;
  pointer *ppBVar3;
  pointer *pppcVar4;
  size_type *psVar5;
  byte bVar6;
  pointer __src;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  pointer pBVar7;
  double dVar8;
  size_t __size;
  int iVar9;
  char *pcVar10;
  long *plVar11;
  undefined8 *puVar12;
  BRDPoint *pBVar13;
  byte *pbVar14;
  ulong *puVar15;
  long *plVar16;
  BRDPoint BVar17;
  size_type *psVar18;
  size_t __n;
  string *psVar19;
  pointer ppcVar20;
  byte *pbVar21;
  ulong uVar22;
  pointer ppcVar23;
  bool bVar24;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  char *p;
  char *arena;
  string __str;
  vector<char_*,_std::allocator<char_*>_> lines;
  BRDPoint point;
  BRDPin pin;
  char ppn [100];
  byte *local_260;
  long local_258;
  long local_250;
  long lStack_248;
  BVRFile *local_240;
  int local_234;
  char *local_230;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  ulong *local_208;
  long local_200;
  ulong local_1f8 [2];
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8;
  long lStack_1d0;
  vector<char_*,_std::allocator<char_*>_> local_1c8;
  long lStack_1b0;
  long *local_1a8;
  undefined8 local_1a0;
  long local_198;
  undefined8 uStack_190;
  value_type local_188;
  undefined1 local_138 [8];
  undefined8 uStack_130;
  undefined8 local_128;
  BRDPoint BStack_120;
  double local_118;
  char *pcStack_110;
  char *pcStack_108;
  long *local_100 [2];
  long local_f0 [2];
  vector<BRDPin,std::allocator<BRDPin>> *local_e0;
  vector<BRDNail,std::allocator<BRDNail>> *local_d8;
  vector<BRDPoint,std::allocator<BRDPoint>> *local_d0;
  vector<BRDPart,_std::allocator<BRDPart>_> *local_c8;
  char *local_c0;
  undefined1 local_b8 [16];
  double local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  BRDFileBase::BRDFileBase(&this->super_BRDFileBase);
  (this->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__BRDFileBase_0022e368;
  uVar22 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_38 = 0;
  local_c0 = setlocale(1,"C");
  local_240 = this;
  if (4 < uVar22) {
    __size = (uVar22 + 1) * 3;
    pcVar10 = (char *)calloc(1,__size);
    (this->super_BRDFileBase).file_buf = pcVar10;
    if (pcVar10 != (char *)0x0) {
      __src = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start;
      __n = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(pcVar10,__src,__n);
      }
      pcVar10[uVar22] = '\0';
      local_228 = (long *)(pcVar10 + uVar22 + 1);
      pcVar10[__size - 1] = '\0';
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      stringfile(pcVar10,&local_1c8);
      bVar24 = false;
      if (local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start <
          local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_230 = pcVar10 + (__size - 1);
        local_d8 = (vector<BRDNail,std::allocator<BRDNail>> *)&(this->super_BRDFileBase).nails;
        local_c8 = &(this->super_BRDFileBase).parts;
        local_e0 = (vector<BRDPin,std::allocator<BRDPin>> *)&(this->super_BRDFileBase).pins;
        local_d0 = (vector<BRDPoint,std::allocator<BRDPoint>> *)&(this->super_BRDFileBase).format;
        local_234 = 0;
        ppcVar23 = local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        do {
          pbVar14 = (byte *)*ppcVar23;
          pbVar21 = pbVar14 + -1;
          do {
            pbVar14 = pbVar14 + 1;
            bVar6 = pbVar21[1];
            pbVar21 = pbVar21 + 1;
            iVar9 = isspace((uint)bVar6);
          } while (iVar9 != 0);
          ppcVar20 = ppcVar23 + 1;
          if (bVar6 != 0) {
            iVar9 = strcmp((char *)pbVar21,"<<Layout>>");
            if (iVar9 == 0) {
              local_234 = 1;
            }
            else {
              iVar9 = strcmp((char *)pbVar21,"<<Pin>>");
              if (iVar9 == 0) {
                local_234 = 2;
              }
              else {
                iVar9 = strcmp((char *)pbVar21,"<<Nail>>");
                if (iVar9 != 0) {
                  if (local_234 == 3) {
                    local_188.name._0_4_ = 0;
                    local_188.name._4_4_ = 0;
                    local_188.mfgcode._M_dataplus._M_p._0_4_ = 0;
                    local_188.mfgcode._M_dataplus._M_p._4_4_ = 0;
                    local_188.mfgcode._M_string_length = 0x1ed23f;
                    while ((0xd < *pbVar21 || ((0x2601U >> (*pbVar21 & 0x1f) & 1) == 0))) {
                      pbVar21 = pbVar21 + 1;
                    }
                    local_260 = pbVar21 + (*pbVar21 == 9);
                    local_a8 = strtod((char *)local_260,(char **)&local_260);
                    pbVar21 = local_260;
                    local_a8 = local_a8 * 1000.0;
                    dVar8 = trunc(local_a8);
                    local_188.name._4_4_ = (int)dVar8;
                    dVar8 = strtod((char *)pbVar21,(char **)&local_260);
                    local_b8._8_4_ = extraout_XMM0_Dc;
                    local_b8._0_8_ = dVar8 * 1000.0;
                    local_b8._12_4_ = extraout_XMM0_Dd;
                    dVar8 = trunc(dVar8 * 1000.0);
                    local_188.mfgcode._M_dataplus._M_p._0_4_ = (int)dVar8;
                    strtol((char *)local_260,(char **)&local_260,10);
                    pbVar21 = local_260;
                    if (*local_260 != 0) {
                      iVar9 = isspace((uint)*local_260);
                      while (iVar9 != 0) {
                        pbVar21 = pbVar21 + 1;
                        if (*pbVar21 == 0) break;
                        iVar9 = isspace((uint)*pbVar21);
                      }
                    }
                    local_260 = pbVar21;
                    pbVar14 = local_260;
                    pbVar21 = local_260;
                    if (*local_260 != 0) {
                      iVar9 = isspace((uint)*local_260);
                      pbVar21 = pbVar14;
                      while (iVar9 == 0) {
                        pbVar21 = pbVar21 + 1;
                        if (*pbVar21 == 0) break;
                        iVar9 = isspace((uint)*pbVar21);
                      }
                    }
                    local_260 = pbVar21;
                    *local_260 = 0;
                    local_260 = local_260 + 1;
                    fix_to_utf8((char *)pbVar14,(char **)&local_228,local_230);
                    pbVar21 = local_260;
                    if (*local_260 != 0) {
                      iVar9 = isspace((uint)*local_260);
                      while (iVar9 != 0) {
                        pbVar21 = pbVar21 + 1;
                        if (*pbVar21 == 0) break;
                        iVar9 = isspace((uint)*pbVar21);
                      }
                    }
                    local_260 = pbVar21;
                    pbVar14 = local_260;
                    pbVar21 = local_260;
                    if (*local_260 != 0) {
                      iVar9 = isspace((uint)*local_260);
                      pbVar21 = pbVar14;
                      while (iVar9 == 0) {
                        pbVar21 = pbVar21 + 1;
                        if (*pbVar21 == 0) break;
                        iVar9 = isspace((uint)*pbVar21);
                      }
                    }
                    local_260 = pbVar21;
                    *local_260 = 0;
                    local_260 = local_260 + 1;
                    pcVar10 = fix_to_utf8((char *)pbVar14,(char **)&local_228,local_230);
                    iVar9 = strcmp(pcVar10,"(T)");
                    pbVar21 = local_260;
                    if (iVar9 == 0) {
                      local_188.mfgcode._M_dataplus._M_p._4_4_ = 2;
                    }
                    else {
                      local_188.mfgcode._M_dataplus._M_p._4_4_ = 1;
                    }
                    if (*local_260 != 0) {
                      iVar9 = isspace((uint)*local_260);
                      while (iVar9 != 0) {
                        pbVar21 = pbVar21 + 1;
                        if (*pbVar21 == 0) break;
                        iVar9 = isspace((uint)*pbVar21);
                      }
                    }
                    local_260 = pbVar21;
                    pbVar14 = local_260;
                    pbVar21 = local_260;
                    if (*local_260 != 0) {
                      iVar9 = isspace((uint)*local_260);
                      pbVar21 = pbVar14;
                      while (iVar9 == 0) {
                        pbVar21 = pbVar21 + 1;
                        if (*pbVar21 == 0) break;
                        iVar9 = isspace((uint)*pbVar21);
                      }
                    }
                    local_260 = pbVar21;
                    *local_260 = 0;
                    local_260 = local_260 + 1;
                    fix_to_utf8((char *)pbVar14,(char **)&local_228,local_230);
                    pbVar21 = local_260;
                    if (*local_260 != 0) {
                      iVar9 = isspace((uint)*local_260);
                      while (iVar9 != 0) {
                        pbVar21 = pbVar21 + 1;
                        if (*pbVar21 == 0) break;
                        iVar9 = isspace((uint)*pbVar21);
                      }
                    }
                    local_260 = pbVar21;
                    pbVar14 = local_260;
                    pbVar21 = local_260;
                    if (*local_260 != 0) {
                      iVar9 = isspace((uint)*local_260);
                      pbVar21 = pbVar14;
                      while (iVar9 == 0) {
                        pbVar21 = pbVar21 + 1;
                        if (*pbVar21 == 0) break;
                        iVar9 = isspace((uint)*pbVar21);
                      }
                    }
                    local_260 = pbVar21;
                    *local_260 = 0;
                    local_260 = local_260 + 1;
                    local_188.mfgcode._M_string_length =
                         (size_type)fix_to_utf8((char *)pbVar14,(char **)&local_228,local_230);
                    local_188.name._4_4_ = (int)local_a8;
                    local_188.mfgcode._M_dataplus._M_p._0_4_ = (int)(double)local_b8._0_8_;
                    __position_00._M_current =
                         (this->super_BRDFileBase).nails.
                         super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (__position_00._M_current ==
                        (this->super_BRDFileBase).nails.
                        super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<BRDNail,std::allocator<BRDNail>>::
                      _M_realloc_insert<BRDNail_const&>
                                (local_d8,__position_00,(BRDNail *)&local_188);
                    }
                    else {
                      (__position_00._M_current)->net = (char *)local_188.mfgcode._M_string_length;
                      (__position_00._M_current)->probe = (int)local_188.name;
                      ((__position_00._M_current)->pos).x = local_188.name._4_4_;
                      *(ulong *)&((__position_00._M_current)->pos).y =
                           CONCAT44(local_188.mfgcode._M_dataplus._M_p._4_4_,
                                    (int)local_188.mfgcode._M_dataplus._M_p);
                      ppBVar3 = &(this->super_BRDFileBase).nails.
                                 super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                                 super__Vector_impl_data._M_finish;
                      *ppBVar3 = *ppBVar3 + 1;
                    }
                  }
                  else {
                    local_260 = pbVar21;
                    if (local_234 == 2) {
                      local_188.name._0_4_ = 0;
                      local_188.name._4_4_ = 0;
                      local_188.mfgcode._M_dataplus._M_p = (pointer)&local_188.mfgcode.field_2;
                      local_188.mfgcode._M_string_length = 0;
                      local_188.mfgcode.field_2._M_allocated_capacity =
                           local_188.mfgcode.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      local_188.p1.y = 0;
                      local_188.p2.x = 0;
                      local_188.p2.y = 0;
                      local_188.mounting_side = Both;
                      local_188.part_type = SMD;
                      local_188.end_of_pins = 0;
                      local_188.p1.x = 0;
                      local_138._0_4_ = 0;
                      local_138._4_4_ = 0;
                      uStack_130._0_4_ = 0;
                      uStack_130._4_4_ = 0;
                      local_128 = local_128 & 0xffffffff00000000;
                      BStack_120 = (BRDPoint)0x1ed23f;
                      local_118 = 0.5;
                      pcStack_110 = (char *)0x0;
                      pcStack_108 = (char *)0x0;
                      if (*pbVar21 != 0) {
                        iVar9 = isspace((uint)*pbVar21);
                        for (; (iVar9 != 0 && (pbVar21 = pbVar14, *pbVar14 != 0));
                            pbVar14 = pbVar14 + 1) {
                          iVar9 = isspace((uint)*pbVar14);
                        }
                      }
                      local_260 = pbVar21;
                      pbVar14 = local_260;
                      pbVar21 = local_260;
                      if (*local_260 != 0) {
                        iVar9 = isspace((uint)*local_260);
                        pbVar21 = pbVar14;
                        while (iVar9 == 0) {
                          pbVar21 = pbVar21 + 1;
                          if (*pbVar21 == 0) break;
                          iVar9 = isspace((uint)*pbVar21);
                        }
                      }
                      local_260 = pbVar21;
                      *local_260 = 0;
                      local_260 = local_260 + 1;
                      pcVar10 = fix_to_utf8((char *)pbVar14,(char **)&local_228,local_230);
                      pbVar21 = local_260;
                      local_188.name._0_4_ = (int)pcVar10;
                      local_188.name._4_4_ = (int)((ulong)pcVar10 >> 0x20);
                      local_188._40_8_ = local_188._40_8_ & 0xffffffff;
                      if (*local_260 != 0) {
                        iVar9 = isspace((uint)*local_260);
                        while (iVar9 != 0) {
                          pbVar21 = pbVar21 + 1;
                          if (*pbVar21 == 0) break;
                          iVar9 = isspace((uint)*pbVar21);
                        }
                      }
                      local_260 = pbVar21;
                      pbVar14 = local_260;
                      pbVar21 = local_260;
                      if (*local_260 != 0) {
                        iVar9 = isspace((uint)*local_260);
                        pbVar21 = pbVar14;
                        while (iVar9 == 0) {
                          pbVar21 = pbVar21 + 1;
                          if (*pbVar21 == 0) break;
                          iVar9 = isspace((uint)*pbVar21);
                        }
                      }
                      local_260 = pbVar21;
                      *local_260 = 0;
                      local_260 = local_260 + 1;
                      pcVar10 = fix_to_utf8((char *)pbVar14,(char **)&local_228,local_230);
                      iVar9 = strcmp(pcVar10,"(T)");
                      local_188.mounting_side = (iVar9 == 0) + Bottom;
                      iVar9 = strcmp((char *)&local_98,
                                     (char *)CONCAT44(local_188.name._4_4_,(int)local_188.name));
                      if (iVar9 != 0) {
                        local_188.end_of_pins = 0;
                        std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                                  (local_c8,&local_188);
                        snprintf((char *)&local_98,100,"%s",
                                 CONCAT44(local_188.name._4_4_,(int)local_188.name));
                      }
                      uStack_130._4_4_ =
                           (int)((ulong)((long)(this->super_BRDFileBase).parts.
                                               super__Vector_base<BRDPart,_std::allocator<BRDPart>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->super_BRDFileBase).parts.
                                              super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 3) *
                           0x38e38e39;
                      strtol((char *)local_260,(char **)&local_260,10);
                      pbVar21 = local_260;
                      if (*local_260 != 0) {
                        iVar9 = isspace((uint)*local_260);
                        while (iVar9 != 0) {
                          pbVar21 = pbVar21 + 1;
                          if (*pbVar21 == 0) break;
                          iVar9 = isspace((uint)*pbVar21);
                        }
                      }
                      local_260 = pbVar21;
                      pbVar14 = local_260;
                      pbVar21 = local_260;
                      if (*local_260 != 0) {
                        iVar9 = isspace((uint)*local_260);
                        pbVar21 = pbVar14;
                        while (iVar9 == 0) {
                          pbVar21 = pbVar21 + 1;
                          if (*pbVar21 == 0) break;
                          iVar9 = isspace((uint)*pbVar21);
                        }
                      }
                      local_260 = pbVar21;
                      *local_260 = 0;
                      local_260 = local_260 + 1;
                      pcStack_108 = fix_to_utf8((char *)pbVar14,(char **)&local_228,local_230);
                      dVar8 = strtod((char *)local_260,(char **)&local_260);
                      dVar8 = trunc(dVar8 * 1000.0);
                      local_138._0_4_ = (int)dVar8;
                      dVar8 = strtod((char *)local_260,(char **)&local_260);
                      dVar8 = trunc(dVar8 * 1000.0);
                      local_138._4_4_ = (int)dVar8;
                      strtol((char *)local_260,(char **)&local_260,10);
                      pbVar21 = local_260;
                      if (*local_260 != 0) {
                        iVar9 = isspace((uint)*local_260);
                        while (iVar9 != 0) {
                          pbVar21 = pbVar21 + 1;
                          if (*pbVar21 == 0) break;
                          iVar9 = isspace((uint)*pbVar21);
                        }
                      }
                      local_260 = pbVar21;
                      pbVar14 = local_260;
                      pbVar21 = local_260;
                      if (*local_260 != 0) {
                        iVar9 = isspace((uint)*local_260);
                        pbVar21 = pbVar14;
                        while (iVar9 == 0) {
                          pbVar21 = pbVar21 + 1;
                          if (*pbVar21 == 0) break;
                          iVar9 = isspace((uint)*pbVar21);
                        }
                      }
                      local_260 = pbVar21;
                      *local_260 = 0;
                      local_260 = local_260 + 1;
                      BStack_120 = (BRDPoint)
                                   fix_to_utf8((char *)pbVar14,(char **)&local_228,local_230);
                      if (local_188.mounting_side == Both) {
                        local_128 = (ulong)local_128._4_4_ << 0x20;
                      }
                      else if (local_188.mounting_side == Bottom) {
                        local_128 = CONCAT44(local_128._4_4_,1);
                      }
                      else if (local_188.mounting_side == Top) {
                        local_128 = CONCAT44(local_128._4_4_,2);
                      }
                      __position_01._M_current =
                           (this->super_BRDFileBase).pins.
                           super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (__position_01._M_current ==
                          (this->super_BRDFileBase).pins.
                          super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<BRDPin,std::allocator<BRDPin>>::_M_realloc_insert<BRDPin_const&>
                                  (local_e0,__position_01,(BRDPin *)local_138);
                      }
                      else {
                        (__position_01._M_current)->name = pcStack_108;
                        (__position_01._M_current)->radius = local_118;
                        (__position_01._M_current)->snum = pcStack_110;
                        *(ulong *)&(__position_01._M_current)->side = local_128;
                        (__position_01._M_current)->net = (char *)BStack_120;
                        ((__position_01._M_current)->pos).x = local_138._0_4_;
                        ((__position_01._M_current)->pos).y = local_138._4_4_;
                        (__position_01._M_current)->probe = (int)uStack_130;
                        (__position_01._M_current)->part = uStack_130._4_4_;
                        ppBVar2 = &(this->super_BRDFileBase).pins.
                                   super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                                   super__Vector_impl_data._M_finish;
                        *ppBVar2 = *ppBVar2 + 1;
                      }
                      (this->super_BRDFileBase).parts.
                      super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1].end_of_pins =
                           (int)((ulong)((long)(this->super_BRDFileBase).pins.
                                               super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->super_BRDFileBase).pins.
                                              super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 3) *
                           -0x49249249;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_188.mfgcode._M_dataplus._M_p != &local_188.mfgcode.field_2) {
                        operator_delete(local_188.mfgcode._M_dataplus._M_p,
                                        local_188.mfgcode.field_2._M_allocated_capacity + 1);
                      }
                    }
                    else if (local_234 == 1) {
                      local_188.name._0_4_ = 0;
                      local_188.name._4_4_ = 0;
                      dVar8 = strtod((char *)pbVar21,(char **)&local_260);
                      dVar8 = trunc(dVar8 * 1000.0);
                      local_188.name._0_4_ = (int)dVar8;
                      if (*local_260 == 0x2c) {
                        local_260 = local_260 + 1;
                      }
                      dVar8 = strtod((char *)local_260,(char **)&local_260);
                      dVar8 = trunc(dVar8 * 1000.0);
                      local_188.name._4_4_ = (int)dVar8;
                      __position._M_current =
                           (this->super_BRDFileBase).format.
                           super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (__position._M_current ==
                          (this->super_BRDFileBase).format.
                          super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<BRDPoint,std::allocator<BRDPoint>>::
                        _M_realloc_insert<BRDPoint_const&>
                                  (local_d0,__position,(BRDPoint *)&local_188);
                      }
                      else {
                        BVar17.y = local_188.name._4_4_;
                        BVar17.x = (int)local_188.name;
                        *__position._M_current = BVar17;
                        ppBVar1 = &(this->super_BRDFileBase).format.
                                   super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                                   super__Vector_impl_data._M_finish;
                        *ppBVar1 = *ppBVar1 + 1;
                      }
                    }
                  }
                  goto LAB_0013f3ea;
                }
                local_234 = 3;
              }
            }
            ppcVar20 = ppcVar23 + 2;
          }
LAB_0013f3ea:
          ppcVar23 = ppcVar20;
        } while (ppcVar20 <
                 local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
        bVar24 = local_234 != 0;
      }
      pBVar7 = (this->super_BRDFileBase).format.
               super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
               super__Vector_impl_data._M_finish;
      (this->super_BRDFileBase).num_parts =
           (int)((ulong)((long)(this->super_BRDFileBase).parts.
                               super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->super_BRDFileBase).parts.
                              super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
      (this->super_BRDFileBase).num_pins =
           (int)((ulong)((long)(this->super_BRDFileBase).pins.
                               super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->super_BRDFileBase).pins.
                              super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) * -0x49249249;
      (this->super_BRDFileBase).num_format =
           (uint)((ulong)((long)pBVar7 -
                         (long)(this->super_BRDFileBase).format.
                               super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
      (this->super_BRDFileBase).num_nails =
           (int)((ulong)((long)(this->super_BRDFileBase).nails.
                               super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->super_BRDFileBase).nails.
                              super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) * -0x55555555;
      setlocale(1,local_c0);
      (this->super_BRDFileBase).valid = bVar24;
      if (local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return;
      }
      operator_delete(local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
      return;
    }
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BVRFile.cpp"
               ,"");
    plVar11 = (long *)std::__cxx11::string::append((char *)local_100);
    puVar15 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar15) {
      local_1d8 = *puVar15;
      lStack_1d0 = plVar11[3];
      local_1e8 = &local_1d8;
    }
    else {
      local_1d8 = *puVar15;
      local_1e8 = (ulong *)*plVar11;
    }
    local_1e0 = plVar11[1];
    *plVar11 = (long)puVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_208 = local_1f8;
    std::__cxx11::string::_M_construct((ulong)&local_208,'\x02');
    *(undefined2 *)local_208 = 0x3433;
    uVar22 = 0xf;
    if (local_1e8 != &local_1d8) {
      uVar22 = local_1d8;
    }
    if (uVar22 < (ulong)(local_200 + local_1e0)) {
      uVar22 = 0xf;
      if (local_208 != local_1f8) {
        uVar22 = local_1f8[0];
      }
      if ((ulong)(local_200 + local_1e0) <= uVar22) {
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_1e8);
        goto LAB_00140403;
      }
    }
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_208);
LAB_00140403:
    local_1a8 = &local_198;
    plVar11 = puVar12 + 2;
    if ((long *)*puVar12 == plVar11) {
      local_198 = *plVar11;
      uStack_190 = puVar12[3];
    }
    else {
      local_198 = *plVar11;
      local_1a8 = (long *)*puVar12;
    }
    local_1a0 = puVar12[1];
    *puVar12 = plVar11;
    puVar12[1] = 0;
    *(undefined1 *)plVar11 = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    local_260 = (byte *)&local_250;
    pbVar21 = (byte *)(plVar11 + 2);
    if ((byte *)*plVar11 == pbVar21) {
      local_250 = *(long *)pbVar21;
      lStack_248 = plVar11[3];
    }
    else {
      local_250 = *(long *)pbVar21;
      local_260 = (byte *)*plVar11;
    }
    local_258 = plVar11[1];
    *plVar11 = (long)pbVar21;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_260);
    local_228 = &local_218;
    plVar16 = plVar11 + 2;
    if ((long *)*plVar11 == plVar16) {
      local_218 = *plVar16;
      lStack_210 = plVar11[3];
    }
    else {
      local_218 = *plVar16;
      local_228 = (long *)*plVar11;
    }
    local_220 = plVar11[1];
    *plVar11 = (long)plVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_228);
    local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
    plVar16 = plVar11 + 2;
    if ((pointer *)*plVar11 == (pointer *)plVar16) {
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*plVar16;
      lStack_1b0 = plVar11[3];
    }
    else {
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*plVar16;
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*plVar11;
    }
    local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)plVar11[1];
    *plVar11 = (long)plVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    pBVar13 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1c8);
    BVar17 = (BRDPoint)(pBVar13 + 2);
    if (*pBVar13 == BVar17) {
      local_128 = *(ulong *)BVar17;
      BStack_120 = pBVar13[3];
      local_138 = (undefined1  [8])&local_128;
    }
    else {
      local_128 = *(ulong *)BVar17;
      local_138 = (undefined1  [8])*pBVar13;
    }
    uStack_130 = pBVar13[1];
    *pBVar13 = BVar17;
    pBVar13[1].x = 0;
    pBVar13[1].y = 0;
    *(undefined1 *)&pBVar13[2].x = 0;
    plVar11 = (long *)std::__cxx11::string::append(local_138);
    psVar5 = &local_188.mfgcode._M_string_length;
    psVar18 = (size_type *)(plVar11 + 2);
    if ((size_type *)*plVar11 == psVar18) {
      local_188.mfgcode._M_string_length = *psVar18;
      local_188.mfgcode.field_2._M_allocated_capacity = plVar11[3];
      local_188.name = (char *)psVar5;
    }
    else {
      local_188.mfgcode._M_string_length = *psVar18;
      local_188.name = (char *)*plVar11;
    }
    local_188.mfgcode._M_dataplus._M_p._0_4_ = (int)plVar11[1];
    local_188.mfgcode._M_dataplus._M_p._4_4_ = (undefined4)((ulong)plVar11[1] >> 0x20);
    *plVar11 = (long)psVar18;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    psVar19 = &(this->super_BRDFileBase).error_msg;
    std::__cxx11::string::operator=((string *)psVar19,(string *)&local_188);
    if ((size_type *)local_188.name != psVar5) {
      operator_delete(local_188.name,local_188.mfgcode._M_string_length + 1);
    }
    if (local_138 != (undefined1  [8])&local_128) {
      operator_delete((void *)local_138,local_128 + 1);
    }
    if ((pointer *)
        local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if (local_260 != (byte *)&local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if (local_100[0] != local_f0) {
      operator_delete(local_100[0],local_f0[0] + 1);
    }
    SDL_LogError(1,"%s",(psVar19->_M_dataplus)._M_p);
    return;
  }
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BVRFile.cpp"
             ,"");
  plVar11 = (long *)std::__cxx11::string::append((char *)local_100);
  puVar15 = (ulong *)(plVar11 + 2);
  if ((ulong *)*plVar11 == puVar15) {
    local_1d8 = *puVar15;
    lStack_1d0 = plVar11[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *puVar15;
    local_1e8 = (ulong *)*plVar11;
  }
  local_1e0 = plVar11[1];
  *plVar11 = (long)puVar15;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  local_208 = local_1f8;
  std::__cxx11::string::_M_construct((ulong)&local_208,'\x02');
  *(undefined2 *)local_208 = 0x3133;
  uVar22 = 0xf;
  if (local_1e8 != &local_1d8) {
    uVar22 = local_1d8;
  }
  if (uVar22 < (ulong)(local_200 + local_1e0)) {
    uVar22 = 0xf;
    if (local_208 != local_1f8) {
      uVar22 = local_1f8[0];
    }
    if ((ulong)(local_200 + local_1e0) <= uVar22) {
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_1e8);
      goto LAB_0013ffdc;
    }
  }
  puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_208);
LAB_0013ffdc:
  local_1a8 = &local_198;
  plVar11 = puVar12 + 2;
  if ((long *)*puVar12 == plVar11) {
    local_198 = *plVar11;
    uStack_190 = puVar12[3];
  }
  else {
    local_198 = *plVar11;
    local_1a8 = (long *)*puVar12;
  }
  local_1a0 = puVar12[1];
  *puVar12 = plVar11;
  puVar12[1] = 0;
  *(undefined1 *)plVar11 = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  local_260 = (byte *)&local_250;
  pbVar21 = (byte *)(plVar11 + 2);
  if ((byte *)*plVar11 == pbVar21) {
    local_250 = *(long *)pbVar21;
    lStack_248 = plVar11[3];
  }
  else {
    local_250 = *(long *)pbVar21;
    local_260 = (byte *)*plVar11;
  }
  local_258 = plVar11[1];
  *plVar11 = (long)pbVar21;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_260);
  local_228 = &local_218;
  plVar16 = plVar11 + 2;
  if ((long *)*plVar11 == plVar16) {
    local_218 = *plVar16;
    lStack_210 = plVar11[3];
  }
  else {
    local_218 = *plVar16;
    local_228 = (long *)*plVar11;
  }
  local_220 = plVar11[1];
  *plVar11 = (long)plVar16;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_228);
  pppcVar4 = &local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  plVar16 = plVar11 + 2;
  if ((pointer *)*plVar11 == (pointer *)plVar16) {
    local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar16;
    lStack_1b0 = plVar11[3];
    local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)pppcVar4;
  }
  else {
    local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar16;
    local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*plVar11;
  }
  local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)plVar11[1];
  *plVar11 = (long)plVar16;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  pBVar13 = (BRDPoint *)std::__cxx11::string::append((char *)&local_1c8);
  BVar17 = (BRDPoint)(pBVar13 + 2);
  if (*pBVar13 == BVar17) {
    local_128 = *(ulong *)BVar17;
    BStack_120 = pBVar13[3];
    local_138 = (undefined1  [8])&local_128;
  }
  else {
    local_128 = *(ulong *)BVar17;
    local_138 = (undefined1  [8])*pBVar13;
  }
  uStack_130 = pBVar13[1];
  *pBVar13 = BVar17;
  pBVar13[1].x = 0;
  pBVar13[1].y = 0;
  *(undefined1 *)&pBVar13[2].x = 0;
  plVar11 = (long *)std::__cxx11::string::append(local_138);
  psVar5 = &local_188.mfgcode._M_string_length;
  psVar18 = (size_type *)(plVar11 + 2);
  if ((size_type *)*plVar11 == psVar18) {
    local_188.mfgcode._M_string_length = *psVar18;
    local_188.mfgcode.field_2._M_allocated_capacity = plVar11[3];
    local_188.name = (char *)psVar5;
  }
  else {
    local_188.mfgcode._M_string_length = *psVar18;
    local_188.name = (char *)*plVar11;
  }
  local_188.mfgcode._M_dataplus._M_p._0_4_ = (int)plVar11[1];
  local_188.mfgcode._M_dataplus._M_p._4_4_ = (undefined4)((ulong)plVar11[1] >> 0x20);
  *plVar11 = (long)psVar18;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  psVar19 = &(this->super_BRDFileBase).error_msg;
  std::__cxx11::string::operator=((string *)psVar19,(string *)&local_188);
  if ((size_type *)local_188.name != psVar5) {
    operator_delete(local_188.name,local_188.mfgcode._M_string_length + 1);
  }
  if (local_138 != (undefined1  [8])&local_128) {
    operator_delete((void *)local_138,local_128 + 1);
  }
  if ((pointer *)
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start != pppcVar4) {
    operator_delete(local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if (local_260 != (byte *)&local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  SDL_LogError(1,"%s",(psVar19->_M_dataplus)._M_p);
  return;
}

Assistant:

BVRFile::BVRFile(std::vector<char> &buf) {
	auto buffer_size = buf.size();

	char *saved_locale;
	char ppn[100] = {0};                        // previous part name
	saved_locale  = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	int current_block = 0;

	std::vector<char *> lines;
	stringfile(file_buf, lines);

	std::vector<char *>::iterator line_it = lines.begin();
	while (line_it < lines.end()) {
		char *line = *line_it;
		++line_it;

		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		if (!strcmp(line, "<<Layout>>")) {
			//			fprintf(stderr,"HIT LAYOUT\n");
			current_block = 1;
			line_it += 1; // Skip 1 unused lines before 1st layout
			continue;
		}
		if (!strcmp(line, "<<Pin>>")) {
			current_block = 2;
			//			fprintf(stderr,"HIT PIN, block = %d\n", current_block);
			line_it += 1; // Skip 1 unused lines before 1st pin
			continue;
		}
		if (!strcmp(line, "<<Nail>>")) {
			//			fprintf(stderr,"HIT NAIL\n");
			current_block = 3;
			line_it += 1; // Skip 1 unused lines before 1st nail
			continue;
		}

		char *p = line;
		char *s;

		switch (current_block) {
			case 1: { // Format
				BRDPoint point;
				double x = READ_DOUBLE();
				point.x  = trunc(x * 1000); // OBV uses integers
				if (*p == ',') p++;
				double y = READ_DOUBLE();
				point.y  = trunc(y * 1000);
				format.push_back(point);
			} break;

			case 2: { // Parts & Pins
				BRDPart part;
				BRDPin pin;

				part.name      = READ_STR();
				part.part_type = BRDPartType::SMD;
				char *loc      = READ_STR();
				if (!strcmp(loc, "(T)"))
					part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
				else
					part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom

				// If this is the first time we've seen this part
				if ((strcmp(ppn, part.name))) {
					part.end_of_pins = 0;
					parts.push_back(part);
					snprintf(ppn, sizeof(ppn), "%s", part.name);
				}

				pin.part = parts.size(); // the part this pin is associated with, is the last part on the vector

				/*int id =*/READ_INT(); // uint
				pin.name = READ_STR();
				double posx = READ_DOUBLE();
				pin.pos.x   = trunc(posx * 1000);
				double posy = READ_DOUBLE();
				pin.pos.y   = trunc(posy * 1000);
				/*int layer =*/READ_INT(); // uint
				pin.net = READ_STR();
				// pin.probe = READ_INT();
				switch (part.mounting_side) {
					case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
					case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
					case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
				}
				//
				pins.push_back(pin);
				parts.back().end_of_pins = pins.size();
			} break;

			case 3: { // Nails
				BRDNail nail;

				p           = nextfield(p);
				double posx = READ_DOUBLE();
				nail.pos.x  = trunc(posx * 1000);
				double posy = READ_DOUBLE();
				nail.pos.y  = trunc(posy * 1000);
				/*int type =*/READ_INT(); // uint
				/*char *grid =*/READ_STR();
				char *loc = READ_STR();
				if (!strcmp(loc, "(T)"))
					nail.side = BRDPartMountingSide::Top;
				else
					nail.side = BRDPartMountingSide::Bottom;

				/*char *netid =*/READ_STR();
				nail.net   = READ_STR();
				nail.pos.x = posx * 1000;
				nail.pos.y = posy * 1000;
				nails.push_back(nail);
				// nail.probe = READ_INT();
				//
			} break;

			default: continue;
		}
	}

	num_parts  = parts.size();
	num_pins   = pins.size();
	num_format = format.size();
	num_nails  = nails.size();

	setlocale(LC_NUMERIC, saved_locale); // Restore locale

	valid = current_block != 0;
}